

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_sinks.h
# Opt level: O3

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::~rotating_file_sink
          (rotating_file_sink<std::mutex> *this)

{
  pointer pcVar1;
  
  details::file_helper::~file_helper(&this->_file_helper);
  pcVar1 = (this->_base_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_base_filename).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

class rotating_file_sink SPDLOG_FINAL : public base_sink<Mutex>
{
public:
    rotating_file_sink(filename_t base_filename, std::size_t max_size, std::size_t max_files)
        : _base_filename(std::move(base_filename))
        , _max_size(max_size)
        , _max_files(max_files)
    {
        _file_helper.open(calc_filename(_base_filename, 0));
        _current_size = _file_helper.size(); // expensive. called only once
    }